

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool google::ParseEncoding(State *state)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 uVar7;
  int iVar8;
  short sVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  long lVar13;
  State copy;
  undefined2 local_5a;
  undefined6 uStack_58;
  
  pcVar2 = state->mangled_cur;
  pcVar3 = state->out_cur;
  pcVar4 = state->out_begin;
  pcVar5 = state->out_end;
  pcVar6 = state->prev_name;
  iVar8 = state->prev_name_length;
  sVar9 = state->nest_level;
  bVar11 = state->append;
  bVar12 = state->overflowed;
  bVar10 = ParseName(state);
  if ((bVar10) && (bVar10 = ParseBareFunctionType(state), bVar10)) {
    return true;
  }
  state->prev_name = pcVar6;
  state->prev_name_length = iVar8;
  state->nest_level = sVar9;
  state->append = bVar11;
  state->overflowed = bVar12;
  state->out_begin = pcVar4;
  state->out_end = pcVar5;
  state->mangled_cur = pcVar2;
  state->out_cur = pcVar3;
  bVar11 = ParseName(state);
  bVar12 = true;
  if (!bVar11) {
    pcVar3 = state->mangled_cur;
    pcVar4 = state->out_cur;
    pcVar5 = state->out_begin;
    pcVar6 = state->out_end;
    uVar7 = *(undefined8 *)((long)&state->prev_name + 6);
    uStack_58 = (undefined6)((ulong)*(undefined8 *)((long)&state->out_end + 6) >> 0x10);
    local_5a = (undefined2)((ulong)pcVar6 >> 0x30);
    bVar11 = state->append;
    bVar12 = state->overflowed;
    pcVar2 = state->mangled_cur;
    if (*pcVar2 == 'T') {
      state->mangled_cur = pcVar2 + 1;
      bVar10 = true;
      if (pcVar2[1] != 'V') {
        lVar13 = 1;
        do {
          cVar1 = "VTIS"[lVar13];
          if (lVar13 == 4) {
            bVar10 = cVar1 != '\0';
            goto LAB_00131221;
          }
          lVar13 = lVar13 + 1;
        } while (pcVar2[1] != cVar1);
        bVar10 = cVar1 != '\0';
      }
      state->mangled_cur = pcVar2 + 2;
LAB_00131221:
      if ((bVar10) && (bVar10 = ParseType(state), bVar10)) {
        return true;
      }
    }
    state->mangled_cur = pcVar3;
    state->out_cur = pcVar4;
    *(ulong *)((long)&state->out_end + 6) = CONCAT62(uStack_58,local_5a);
    *(undefined8 *)((long)&state->prev_name + 6) = uVar7;
    state->out_begin = pcVar5;
    state->out_end = pcVar6;
    state->append = bVar11;
    state->overflowed = bVar12;
    pcVar2 = state->mangled_cur;
    if ((*pcVar2 == 'T') && (pcVar2[1] == 'c')) {
      state->mangled_cur = pcVar2 + 2;
      bVar10 = ParseCallOffset(state);
      if ((bVar10) &&
         ((bVar10 = ParseCallOffset(state), bVar10 && (bVar10 = ParseEncoding(state), bVar10)))) {
        return true;
      }
    }
    state->mangled_cur = pcVar3;
    state->out_cur = pcVar4;
    *(ulong *)((long)&state->out_end + 6) = CONCAT62(uStack_58,local_5a);
    *(undefined8 *)((long)&state->prev_name + 6) = uVar7;
    state->out_begin = pcVar5;
    state->out_end = pcVar6;
    state->append = bVar11;
    state->overflowed = bVar12;
    pcVar2 = state->mangled_cur;
    if ((*pcVar2 == 'G') && (pcVar2[1] == 'V')) {
      state->mangled_cur = pcVar2 + 2;
      bVar10 = ParseName(state);
      if (bVar10) {
        return true;
      }
    }
    state->mangled_cur = pcVar3;
    state->out_cur = pcVar4;
    *(ulong *)((long)&state->out_end + 6) = CONCAT62(uStack_58,local_5a);
    *(undefined8 *)((long)&state->prev_name + 6) = uVar7;
    state->out_begin = pcVar5;
    state->out_end = pcVar6;
    state->append = bVar11;
    state->overflowed = bVar12;
    if (*state->mangled_cur == 'T') {
      state->mangled_cur = state->mangled_cur + 1;
      bVar10 = ParseCallOffset(state);
      if ((bVar10) && (bVar10 = ParseEncoding(state), bVar10)) {
        return true;
      }
    }
    state->mangled_cur = pcVar3;
    state->out_cur = pcVar4;
    *(ulong *)((long)&state->out_end + 6) = CONCAT62(uStack_58,local_5a);
    *(undefined8 *)((long)&state->prev_name + 6) = uVar7;
    state->out_begin = pcVar5;
    state->out_end = pcVar6;
    state->append = bVar11;
    state->overflowed = bVar12;
    pcVar2 = state->mangled_cur;
    if ((*pcVar2 == 'T') && (pcVar2[1] == 'C')) {
      state->mangled_cur = pcVar2 + 2;
      bVar10 = ParseType(state);
      if ((bVar10) &&
         ((bVar10 = ParseNumber(state,(int *)0x0), bVar10 && (*state->mangled_cur == '_')))) {
        state->mangled_cur = state->mangled_cur + 1;
        state->append = false;
        bVar10 = ParseType(state);
        if (bVar10) {
          state->append = (bool)(bVar11 & 1);
          return true;
        }
      }
    }
    state->mangled_cur = pcVar3;
    state->out_cur = pcVar4;
    *(ulong *)((long)&state->out_end + 6) = CONCAT62(uStack_58,local_5a);
    *(undefined8 *)((long)&state->prev_name + 6) = uVar7;
    state->out_begin = pcVar5;
    state->out_end = pcVar6;
    state->append = bVar11;
    state->overflowed = bVar12;
    pcVar2 = state->mangled_cur;
    if (*pcVar2 == 'T') {
      state->mangled_cur = pcVar2 + 1;
      bVar10 = true;
      if (pcVar2[1] != 'F') {
        lVar13 = 0;
        do {
          cVar1 = "FJ"[lVar13 + 1];
          if (lVar13 == 1) {
            bVar10 = cVar1 != '\0';
            goto LAB_0013141c;
          }
          lVar13 = lVar13 + 1;
        } while (pcVar2[1] != cVar1);
        bVar10 = cVar1 != '\0';
      }
      state->mangled_cur = pcVar2 + 2;
LAB_0013141c:
      if ((bVar10) && (bVar10 = ParseType(state), bVar10)) {
        return true;
      }
    }
    state->mangled_cur = pcVar3;
    state->out_cur = pcVar4;
    *(ulong *)((long)&state->out_end + 6) = CONCAT62(uStack_58,local_5a);
    *(undefined8 *)((long)&state->prev_name + 6) = uVar7;
    state->out_begin = pcVar5;
    state->out_end = pcVar6;
    state->append = bVar11;
    state->overflowed = bVar12;
    pcVar2 = state->mangled_cur;
    if ((*pcVar2 == 'G') && (pcVar2[1] == 'R')) {
      state->mangled_cur = pcVar2 + 2;
      bVar10 = ParseName(state);
      if (bVar10) {
        return true;
      }
    }
    state->mangled_cur = pcVar3;
    state->out_cur = pcVar4;
    *(ulong *)((long)&state->out_end + 6) = CONCAT62(uStack_58,local_5a);
    *(undefined8 *)((long)&state->prev_name + 6) = uVar7;
    state->out_begin = pcVar5;
    state->out_end = pcVar6;
    state->append = bVar11;
    state->overflowed = bVar12;
    pcVar2 = state->mangled_cur;
    if ((*pcVar2 == 'G') && (pcVar2[1] == 'A')) {
      state->mangled_cur = pcVar2 + 2;
      bVar10 = ParseEncoding(state);
      if (bVar10) {
        return true;
      }
    }
    state->mangled_cur = pcVar3;
    state->out_cur = pcVar4;
    *(ulong *)((long)&state->out_end + 6) = CONCAT62(uStack_58,local_5a);
    *(undefined8 *)((long)&state->prev_name + 6) = uVar7;
    state->out_begin = pcVar5;
    state->out_end = pcVar6;
    state->append = bVar11;
    state->overflowed = bVar12;
    pcVar2 = state->mangled_cur;
    if (*pcVar2 == 'T') {
      state->mangled_cur = pcVar2 + 1;
      bVar10 = true;
      if (pcVar2[1] != 'h') {
        lVar13 = 0;
        do {
          cVar1 = "hv"[lVar13 + 1];
          if (lVar13 == 1) {
            bVar10 = cVar1 != '\0';
            goto LAB_00131533;
          }
          lVar13 = lVar13 + 1;
        } while (pcVar2[1] != cVar1);
        bVar10 = cVar1 != '\0';
      }
      state->mangled_cur = pcVar2 + 2;
LAB_00131533:
      if (((bVar10) && (bVar10 = ParseCallOffset(state), bVar10)) &&
         (bVar10 = ParseEncoding(state), bVar10)) {
        return true;
      }
    }
    *(ulong *)((long)&state->out_end + 6) = CONCAT62(uStack_58,local_5a);
    *(undefined8 *)((long)&state->prev_name + 6) = uVar7;
    state->out_begin = pcVar5;
    state->out_end = pcVar6;
    state->mangled_cur = pcVar3;
    state->out_cur = pcVar4;
    state->append = bVar11;
    state->overflowed = bVar12;
    bVar12 = false;
  }
  return bVar12;
}

Assistant:

static bool ParseEncoding(State *state) {
  State copy = *state;
  if (ParseName(state) && ParseBareFunctionType(state)) {
    return true;
  }
  *state = copy;

  if (ParseName(state) || ParseSpecialName(state)) {
    return true;
  }
  return false;
}